

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

void ZSTD_ldm_adjustParameters(ldmParams_t *params,ZSTD_compressionParameters *cParams)

{
  undefined4 *in_RSI;
  long in_RDI;
  undefined4 local_1c;
  int local_18;
  int local_14;
  
  *(undefined4 *)(in_RDI + 0x14) = *in_RSI;
  if (*(int *)(in_RDI + 8) == 0) {
    *(undefined4 *)(in_RDI + 8) = 3;
  }
  if (*(int *)(in_RDI + 0xc) == 0) {
    *(undefined4 *)(in_RDI + 0xc) = 0x40;
  }
  if (*(int *)(in_RDI + 4) == 0) {
    if (*(int *)(in_RDI + 0x14) - 7U < 6) {
      local_14 = 6;
    }
    else {
      local_14 = *(int *)(in_RDI + 0x14) + -7;
    }
    *(int *)(in_RDI + 4) = local_14;
    if (0x1e < *(uint *)(in_RDI + 4)) {
      __assert_fail("params->hashLog <= ZSTD_HASHLOG_MAX",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x7cdf,
                    "void ZSTD_ldm_adjustParameters(ldmParams_t *, const ZSTD_compressionParameters *)"
                   );
    }
  }
  if (*(int *)(in_RDI + 0x10) == 0) {
    if (*(uint *)(in_RDI + 0x14) < *(uint *)(in_RDI + 4)) {
      local_18 = 0;
    }
    else {
      local_18 = *(int *)(in_RDI + 0x14) - *(int *)(in_RDI + 4);
    }
    *(int *)(in_RDI + 0x10) = local_18;
  }
  if (*(uint *)(in_RDI + 8) < *(uint *)(in_RDI + 4)) {
    local_1c = *(undefined4 *)(in_RDI + 8);
  }
  else {
    local_1c = *(undefined4 *)(in_RDI + 4);
  }
  *(undefined4 *)(in_RDI + 8) = local_1c;
  return;
}

Assistant:

void ZSTD_ldm_adjustParameters(ldmParams_t* params,
                               ZSTD_compressionParameters const* cParams)
{
    params->windowLog = cParams->windowLog;
    ZSTD_STATIC_ASSERT(LDM_BUCKET_SIZE_LOG <= ZSTD_LDM_BUCKETSIZELOG_MAX);
    DEBUGLOG(4, "ZSTD_ldm_adjustParameters");
    if (!params->bucketSizeLog) params->bucketSizeLog = LDM_BUCKET_SIZE_LOG;
    if (!params->minMatchLength) params->minMatchLength = LDM_MIN_MATCH_LENGTH;
    if (params->hashLog == 0) {
        params->hashLog = MAX(ZSTD_HASHLOG_MIN, params->windowLog - LDM_HASH_RLOG);
        assert(params->hashLog <= ZSTD_HASHLOG_MAX);
    }
    if (params->hashRateLog == 0) {
        params->hashRateLog = params->windowLog < params->hashLog
                                   ? 0
                                   : params->windowLog - params->hashLog;
    }
    params->bucketSizeLog = MIN(params->bucketSizeLog, params->hashLog);
}